

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

void __thiscall
QTextDocumentLayoutPrivate::ensureLayouted(QTextDocumentLayoutPrivate *this,QFixed y)

{
  long lVar1;
  bool bVar2;
  QCheckPoint *pQVar3;
  QFixed in_ESI;
  QTextDocumentLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  QTextDocumentLayout *q;
  QSizeF oldSize;
  uint7 in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_RDI->currentLazyLayoutPosition != -1) {
    QTextDocumentLayout::dynamicDocumentSize((QTextDocumentLayout *)in_RDI);
    bVar2 = QList<QCheckPoint>::isEmpty((QList<QCheckPoint> *)0x80ead8);
    if (bVar2) {
      layoutStep(in_RDI);
    }
    while( true ) {
      bVar2 = false;
      if (in_RDI->currentLazyLayoutPosition != -1) {
        pQVar3 = QList<QCheckPoint>::last((QList<QCheckPoint> *)(ulong)in_stack_ffffffffffffffb8);
        bVar2 = ::operator<((QFixed)(pQVar3->y).val,in_ESI);
      }
      if (bVar2 == false) break;
      layoutStep(in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::ensureLayouted(QFixed y) const
{
    Q_Q(const QTextDocumentLayout);
    if (currentLazyLayoutPosition == -1)
        return;
    const QSizeF oldSize = q->dynamicDocumentSize();
    Q_UNUSED(oldSize);

    if (checkPoints.isEmpty())
        layoutStep();

    while (currentLazyLayoutPosition != -1
           && checkPoints.last().y < y)
        layoutStep();
}